

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkColorComponentFlags Diligent::ColorMaskToVkColorComponentFlags(COLOR_MASK ColorMask)

{
  COLOR_MASK CVar1;
  uint local_10;
  VkColorComponentFlags Flags;
  COLOR_MASK ColorMask_local;
  
  CVar1 = operator&(ColorMask,COLOR_MASK_RED);
  local_10 = (uint)(CVar1 != COLOR_MASK_NONE);
  CVar1 = operator&(ColorMask,COLOR_MASK_GREEN);
  if (CVar1 != COLOR_MASK_NONE) {
    local_10 = local_10 | 2;
  }
  CVar1 = operator&(ColorMask,COLOR_MASK_BLUE);
  if (CVar1 != COLOR_MASK_NONE) {
    local_10 = local_10 | 4;
  }
  CVar1 = operator&(ColorMask,COLOR_MASK_ALPHA);
  if (CVar1 != COLOR_MASK_NONE) {
    local_10 = local_10 | 8;
  }
  return local_10;
}

Assistant:

VkColorComponentFlags ColorMaskToVkColorComponentFlags(COLOR_MASK ColorMask)
{
    VkColorComponentFlags Flags = 0;
    if (ColorMask & COLOR_MASK_RED)
        Flags |= VK_COLOR_COMPONENT_R_BIT;
    if (ColorMask & COLOR_MASK_GREEN)
        Flags |= VK_COLOR_COMPONENT_G_BIT;
    if (ColorMask & COLOR_MASK_BLUE)
        Flags |= VK_COLOR_COMPONENT_B_BIT;
    if (ColorMask & COLOR_MASK_ALPHA)
        Flags |= VK_COLOR_COMPONENT_A_BIT;
    return Flags;
}